

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

int SSL_process_quic_post_handshake(SSL *ssl)

{
  bool bVar1;
  int iVar2;
  SSLMessage msg;
  
  bssl::ssl_reset_error_state(ssl);
  if ((ssl->quic_method != (SSL_QUIC_METHOD *)0x0) && (iVar2 = SSL_in_init(ssl), iVar2 == 0)) {
    bVar1 = bssl::check_read_error(ssl);
    if (!bVar1) {
      return 0;
    }
    while( true ) {
      bVar1 = (*ssl->method->get_message)(ssl,&msg);
      if (!bVar1) {
        return 1;
      }
      iVar2 = ssl_do_post_handshake(ssl,&msg);
      if (iVar2 == 0) break;
      (*ssl->method->next_message)(ssl);
    }
    bssl::ssl_set_read_error(ssl);
    return 0;
  }
  ERR_put_error(0x10,0,0x42,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,0x326);
  return 0;
}

Assistant:

int SSL_process_quic_post_handshake(SSL *ssl) {
  ssl_reset_error_state(ssl);

  if (!SSL_is_quic(ssl) || SSL_in_init(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  // Replay post-handshake message errors.
  if (!check_read_error(ssl)) {
    return 0;
  }

  // Process any buffered post-handshake messages.
  SSLMessage msg;
  while (ssl->method->get_message(ssl, &msg)) {
    // Handle the post-handshake message and try again.
    if (!ssl_do_post_handshake(ssl, msg)) {
      ssl_set_read_error(ssl);
      return 0;
    }
    ssl->method->next_message(ssl);
  }

  return 1;
}